

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.h
# Opt level: O0

void __thiscall Js::TinyDictionary::Add(TinyDictionary *this,PropertyId key,byte value)

{
  char cVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  byte i;
  uint32 bucketIndex;
  byte *buckets;
  byte value_local;
  PropertyId key_local;
  TinyDictionary *this_local;
  
  if (0x7f < value) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0x28,"(value < 128)","value < 128");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar4 = ReduceKeyToIndex(this,key);
  cVar1 = *(char *)((long)this->bucketsData + (ulong)uVar4);
  if (cVar1 == -1 && value != '\x7f') {
    *(byte *)((long)this->bucketsData + (ulong)uVar4) = value | 0x80;
  }
  else {
    *(byte *)((long)this->bucketsData + (ulong)uVar4) = value;
    *(char *)((long)this[1].bucketsData + (ulong)value) = cVar1;
  }
  return;
}

Assistant:

void Add(PropertyId key, byte value)
        {
            Assert(value < 128);

            byte* buckets = reinterpret_cast<byte*>(bucketsData);
            uint32 bucketIndex = ReduceKeyToIndex(key);

            byte i = buckets[bucketIndex];

            // if the bucket was empty (NIL), put a tagged value to indicate the end of the chain.
            // NB: [OS:17745531] In extreme rare cases 127th pid to insert hashes into a a bucket still unused by the previous 126 values.
            //     We cannot tag 127 since it would become NIL and we would lose the value. 
            //     We can however chain 127 --> NIL, since it is the same as having two 127 in the bucket, which is ok.
            if ((i == NIL) & (value != 127))
            {
                // set the highest bit to mark the value as the last in the chain
                buckets[bucketIndex] = value | 128;
            }
            else
            {
                buckets[bucketIndex] = value;
                next[value] = i;
            }
        }